

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsBuiltinPrecisionTests.cpp
# Opt level: O2

PrecisionCase *
deqp::gls::BuiltinPrecisionTests::
createFuncCase<deqp::gls::BuiltinPrecisionTests::Signature<tcu::Matrix<float,4,2>,tcu::Vector<float,4>,tcu::Vector<float,2>,deqp::gls::BuiltinPrecisionTests::Void,deqp::gls::BuiltinPrecisionTests::Void>>
          (Context *context,string *name,
          Func<deqp::gls::BuiltinPrecisionTests::Signature<tcu::Matrix<float,_4,_2>,_tcu::Vector<float,_4>,_tcu::Vector<float,_2>,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>_>
          *func)

{
  int iVar1;
  FuncCase<deqp::gls::BuiltinPrecisionTests::Signature<tcu::Matrix<float,_4,_2>,_tcu::Vector<float,_4>,_tcu::Vector<float,_2>,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>_>
  *this;
  
  iVar1 = (**(code **)(*(long *)func + 0x28))(func);
  if (iVar1 == 1) {
    this = (FuncCase<deqp::gls::BuiltinPrecisionTests::Signature<tcu::Matrix<float,_4,_2>,_tcu::Vector<float,_4>,_tcu::Vector<float,_2>,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>_>
            *)operator_new(0x188);
    InOutFuncCase<deqp::gls::BuiltinPrecisionTests::Signature<tcu::Matrix<float,_4,_2>,_tcu::Vector<float,_4>,_tcu::Vector<float,_2>,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>_>
    ::InOutFuncCase((InOutFuncCase<deqp::gls::BuiltinPrecisionTests::Signature<tcu::Matrix<float,_4,_2>,_tcu::Vector<float,_4>,_tcu::Vector<float,_2>,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>_>
                     *)this,context,name,func);
  }
  else if (iVar1 == -1) {
    this = (FuncCase<deqp::gls::BuiltinPrecisionTests::Signature<tcu::Matrix<float,_4,_2>,_tcu::Vector<float,_4>,_tcu::Vector<float,_2>,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>_>
            *)operator_new(0x188);
    FuncCase<deqp::gls::BuiltinPrecisionTests::Signature<tcu::Matrix<float,_4,_2>,_tcu::Vector<float,_4>,_tcu::Vector<float,_2>,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>_>
    ::FuncCase(this,context,name,func);
  }
  else {
    this = (FuncCase<deqp::gls::BuiltinPrecisionTests::Signature<tcu::Matrix<float,_4,_2>,_tcu::Vector<float,_4>,_tcu::Vector<float,_2>,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>_>
            *)0x0;
  }
  return (PrecisionCase *)this;
}

Assistant:

PrecisionCase* createFuncCase (const Context&	context,
							   const string&	name,
							   const Func<Sig>&	func)
{
	switch (func.getOutParamIndex())
	{
		case -1:
			return new FuncCase<Sig>(context, name, func);
		case 1:
			return new InOutFuncCase<Sig>(context, name, func);
		default:
			DE_FATAL("Impossible");
	}
	return DE_NULL;
}